

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O2

void d68020_callm(m68k_info *info)

{
  uint imm;
  
  if ((info->type & 4) == 0) {
    d68000_invalid(info);
    return;
  }
  imm = read_imm_8(info);
  build_imm_ea(info,0x2a,'\0',imm);
  return;
}

Assistant:

static void d68020_callm(m68k_info *info)
{
	LIMIT_CPU_TYPES(info, M68020_ONLY);
	build_imm_ea(info, M68K_INS_CALLM, 0, read_imm_8(info));
}